

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O3

ON_BrepFaceSide * __thiscall ON_BrepFaceSide::operator=(ON_BrepFaceSide *this,ON_BrepFaceSide *src)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (this != src) {
    this->m_faceside_user = src->m_faceside_user;
    iVar1 = src->m_ri;
    iVar2 = src->m_fi;
    iVar3 = src->m_srf_dir;
    this->m_faceside_index = src->m_faceside_index;
    this->m_ri = iVar1;
    this->m_fi = iVar2;
    this->m_srf_dir = iVar3;
    ON_Object::operator=(&this->super_ON_Object,&src->super_ON_Object);
  }
  return this;
}

Assistant:

ON_BrepFaceSide& ON_BrepFaceSide::operator=(const ON_BrepFaceSide& src)
{
  if ( this != &src)
  {
    // do not copy m_brep pointer
    m_faceside_user = src.m_faceside_user;
    m_faceside_index = src.m_faceside_index;
    m_ri = src.m_ri;
    m_fi = src.m_fi;
    m_srf_dir = src.m_srf_dir;
    ON_Object::operator=(src);
  }
  return *this;
}